

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subdivpatch1base_eval.cpp
# Opt level: O2

BBox3fa * embree::sse2::evalGridBounds
                    (BBox3fa *__return_storage_ptr__,SubdivPatch1Base *patch,uint x0,uint x1,uint y0
                    ,uint y1,uint swidth,uint sheight,SubdivMesh *geom)

{
  ulong uVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *paVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *paVar3;
  undefined8 *puVar4;
  size_t sVar5;
  pointer pRVar6;
  BufferView<embree::Vec3fa> *pBVar7;
  char *pcVar8;
  long lVar9;
  code *pcVar10;
  undefined1 auVar11 [12];
  undefined1 auVar12 [12];
  undefined1 auVar13 [12];
  undefined1 auVar14 [12];
  undefined1 auVar15 [12];
  undefined1 auVar16 [12];
  undefined1 auVar17 [12];
  undefined1 auVar18 [12];
  undefined1 auVar19 [12];
  undefined1 auVar20 [12];
  undefined1 auVar21 [12];
  undefined1 auVar22 [12];
  undefined8 uVar23;
  undefined8 uVar24;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *paVar25;
  uint uVar26;
  uint uVar27;
  size_t i_1;
  ulong uVar28;
  float *pfVar29;
  void *pvVar30;
  long lVar31;
  float *pfVar32;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *Nx;
  uint uVar33;
  float *pfVar34;
  int iVar35;
  long lVar36;
  float *pfVar37;
  float fVar38;
  ulong uVar39;
  float *pfVar40;
  uint uVar41;
  uint uVar42;
  undefined4 *puVar43;
  long lVar44;
  uint uVar45;
  undefined4 in_register_00000084;
  uint uVar46;
  ulong uVar47;
  float *pfVar48;
  uint uVar49;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar50;
  uint i;
  ulong uVar51;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar52;
  ulong uVar53;
  uint uVar54;
  bool bVar55;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  float fVar83;
  float fVar91;
  float fVar92;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  float fVar93;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 in_XMM5 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  float fVar103;
  float fVar104;
  undefined1 in_XMM6 [16];
  float fVar105;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  int iVar106;
  int iVar107;
  int iVar108;
  int iVar109;
  int iVar110;
  int iVar111;
  int iVar112;
  int iVar113;
  GeneralCatmullClarkPatch3fa ccpatch;
  RTCDisplacementFunctionNArguments args;
  Vec3vfx vtx;
  StackArray<float,_16384UL> grid_u;
  Vec3vfx normal;
  vfloatx v;
  vfloatx u;
  undefined1 auStack_22030 [16];
  float fStack_21ffc;
  float fStack_21ff8;
  float fStack_21ff4;
  undefined1 auStack_21ff0 [16];
  ulong uStack_21fd0;
  undefined8 uStack_21fc8;
  undefined1 auStack_21fc0 [16];
  undefined1 auStack_21fb0 [16];
  undefined1 auStack_21fa0 [16];
  float *pfStack_21f88;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aStack_21f00;
  uint uStack_21ef0;
  uint uStack_21eec;
  float *pfStack_21ee8;
  float *pfStack_21ee0;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paStack_21ed8;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paStack_21ed0;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paStack_21ec8;
  float *pfStack_21ec0;
  float *pfStack_21eb8;
  float *pfStack_21eb0;
  uint uStack_21ea8;
  undefined4 auStack_21b9c [1575];
  anon_union_16_2_47237d3f_for_Vec3fa_0 *paStack_20300;
  undefined4 uStack_202c0;
  undefined8 uStack_20280;
  undefined8 uStack_20278;
  float fStack_20270;
  float fStack_2026c;
  undefined8 uStack_20268;
  undefined8 uStack_20260;
  undefined8 uStack_20258;
  undefined1 *puStack_20250;
  undefined1 (*pauStack_20248) [16];
  undefined1 *puStack_20240;
  undefined1 *puStack_20238;
  undefined1 (*pauStack_20230) [16];
  undefined4 uStack_20228;
  float *pfStack_1c280;
  ulong uStack_1c278;
  undefined1 auStack_1c240 [16];
  undefined1 auStack_1c230 [16];
  undefined1 aauStack_1c220 [1022] [16];
  float *pfStack_18240;
  ulong uStack_18238;
  float afStack_18200 [4096];
  float *pfStack_14200;
  ulong uStack_141f8;
  float afStack_141c0 [4096];
  float *pfStack_101c0;
  ulong uStack_101b8;
  undefined1 auStack_10180 [16];
  undefined1 auStack_10170 [16];
  undefined1 aauStack_10160 [1022] [16];
  float *local_c180;
  ulong local_c178;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_c140 [1024];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *local_8140;
  ulong local_8138;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_8100 [1024];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *local_4100;
  ulong local_40f8;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_40c0 [1024];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *local_c0;
  ulong local_b8;
  
  uStack_21fc8 = uStack_21fd0;
  uStack_21fd0._4_4_ = in_register_00000084;
  uStack_21fd0._0_4_ = y0;
  auStack_22030._8_8_ = 0x7f8000007f800000;
  auStack_22030._0_8_ = 0x7f8000007f800000;
  *(undefined8 *)&(__return_storage_ptr__->lower).field_0 = 0x7f8000007f800000;
  *(undefined8 *)((long)&(__return_storage_ptr__->lower).field_0 + 8) = 0x7f8000007f800000;
  auStack_21fa0._8_8_ = 0xff800000ff800000;
  auStack_21fa0._0_8_ = 0xff800000ff800000;
  *(undefined8 *)&(__return_storage_ptr__->upper).field_0 = 0xff800000ff800000;
  *(undefined8 *)((long)&(__return_storage_ptr__->upper).field_0 + 8) = 0xff800000ff800000;
  uVar26 = x1 - x0;
  uVar27 = uVar26 + 1;
  iVar35 = y1 - y0;
  uVar41 = iVar35 + 1;
  uVar42 = uVar41 * uVar27;
  uVar54 = uVar42 + 4;
  uVar47 = (ulong)uVar54;
  pfStack_101c0 = afStack_141c0;
  sVar5 = uVar47 * 4;
  pfStack_14200 = afStack_18200;
  uStack_141f8 = uVar47;
  uStack_101b8 = uVar47;
  if (0x1000 < uVar54) {
    pfStack_101c0 = (float *)alignedMalloc(sVar5,0x40);
    pfStack_14200 = (float *)alignedMalloc(sVar5,0x40);
  }
  uVar33 = uVar42 + 3;
  uVar51 = (ulong)uVar42;
  if (patch->type == '\x05') {
    Nx = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 **)&(geom->super_Geometry).field_0x58;
    uStack_1c278 = uVar47;
    uStack_18238 = uVar47;
    local_c178 = uVar47;
    if (uVar54 < 0x1001) {
      pfStack_1c280 = (float *)&uStack_20280;
      pfStack_18240 = (float *)auStack_1c240;
      local_c180 = (float *)auStack_10180;
    }
    else {
      pfStack_1c280 = (float *)alignedMalloc(sVar5,0x40);
      pfStack_18240 = (float *)alignedMalloc(sVar5,0x40);
      local_c180 = (float *)alignedMalloc(sVar5,0x40);
    }
    if (Nx == (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)0x0) {
      uVar47 = 0;
    }
    local_8138 = uVar47;
    local_40f8 = uVar47;
    local_b8 = uVar47;
    if (uVar47 < 0x1001) {
      local_4100 = local_8100;
      local_8140 = local_c140;
      local_c0 = local_40c0;
    }
    else {
      sVar5 = uVar47 * 4;
      local_4100 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)alignedMalloc(sVar5,0x40);
      local_8140 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)alignedMalloc(sVar5,0x40);
      local_c0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)alignedMalloc(sVar5,0x40);
    }
    pRVar6 = (geom->patch_eval_trees).
             super__Vector_base<embree::PatchT<embree::Vec3fa,_embree::Vec3fa>::Ref,_std::allocator<embree::PatchT<embree::Vec3fa,_embree::Vec3fa>::Ref>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((geom->patch_eval_trees).
        super__Vector_base<embree::PatchT<embree::Vec3fa,_embree::Vec3fa>::Ref,_std::allocator<embree::PatchT<embree::Vec3fa,_embree::Vec3fa>::Ref>_>
        ._M_impl.super__Vector_impl_data._M_finish == pRVar6) {
      lVar44 = 0x40;
      pfVar37 = *(float **)&patch->patch_v[0][0].field_0;
      uVar26 = patch->time_;
      pBVar7 = (geom->vertices).items;
      lVar36 = 0x1c00;
      puVar43 = auStack_21b9c;
      do {
        *(undefined4 **)(puVar43 + -0x49) = puVar43 + -0xc9;
        *(undefined4 **)(puVar43 + -0x19) = puVar43 + -0x39;
        *(undefined8 *)(puVar43 + -2) = 0;
        *puVar43 = 0;
        puVar43 = puVar43 + 0xe0;
        lVar36 = lVar36 + -0x380;
      } while (lVar36 != 0);
      paStack_20300 = &aStack_21f00;
      pcVar8 = pBVar7[uVar26].super_RawBufferView.ptr_ofs;
      uVar28 = (ulong)(uint)pBVar7[uVar26].super_RawBufferView.stride;
      lVar36 = 0x280;
      uVar47 = 0;
      pfStack_21f88 = pfVar37;
      do {
        if ((7 < uVar47) && (paStack_20300 == &aStack_21f00)) {
          pvVar30 = GeneralCatmullClark1RingT<embree::Vec3fa,embree::Vec3fa>::operator_new__(0x3840)
          ;
          *(undefined8 *)((long)pvVar30 + 0x38) = 0x10;
          lVar31 = 0;
          do {
            *(long *)((long)pvVar30 + lVar31 + 0x280) = (long)pvVar30 + lVar31 + 0x80;
            *(long *)((long)pvVar30 + lVar31 + 0x340) = (long)pvVar30 + lVar31 + 0x2c0;
            *(undefined8 *)((long)pvVar30 + lVar31 + 0x39c) = 0;
            *(undefined4 *)((long)pvVar30 + lVar31 + 0x3a4) = 0;
            lVar31 = lVar31 + 0x380;
          } while (lVar31 != 0x3800);
          paStack_20300 = (anon_union_16_2_47237d3f_for_Vec3fa_0 *)((long)pvVar30 + 0x40);
          for (lVar31 = 0; lVar31 != 0x1c00; lVar31 = lVar31 + 0x380) {
            GeneralCatmullClark1RingT<embree::Vec3fa,_embree::Vec3fa>::operator=
                      ((GeneralCatmullClark1RingT<embree::Vec3fa,_embree::Vec3fa> *)
                       ((long)paStack_20300 + lVar31),
                       (GeneralCatmullClark1RingT<embree::Vec3fa,_embree::Vec3fa> *)
                       ((long)&aStack_21f00 + lVar31));
          }
        }
        paVar25 = paStack_20300;
        uVar1 = uVar47 + 1;
        paVar2 = paStack_20300 + uVar47 * 0x38;
        paVar3 = paStack_20300 + uVar47 * 0x38;
        pfVar48 = paVar3->m128 + 0x10;
        *(undefined1 *)(paVar3->m128 + 0xd6) = 1;
        paVar3->m128[0xd2] = -NAN;
        uVar23 = *(undefined8 *)(pcVar8 + (uint)*pfStack_21f88 * uVar28);
        uVar24 = *(undefined8 *)(pcVar8 + (uint)*pfStack_21f88 * uVar28 + 8);
        *(float *)paVar3 = (float)(int)uVar23;
        *(int *)((long)paVar3 + 4) = (int)((ulong)uVar23 >> 0x20);
        *(undefined8 *)&(paVar3->field_1).z = uVar24;
        paVar3->m128[0xd3] = pfStack_21f88[5];
        paVar3->m128[0xd5] = pfStack_21f88[6];
        paVar3->m128[0xd4] = 0.0;
        pfVar29 = paStack_20300->m128 + uVar47 * 0xe0 + 0xa0;
        uVar39 = 0;
        fStack_21ff4 = -NAN;
        fStack_21ff8 = -NAN;
        fStack_21ffc = -NAN;
        uVar53 = 0;
        pfVar32 = pfStack_21f88;
        do {
          pfVar34 = pfVar32 + (long)(int)pfVar32[2] * 8;
          fVar91 = pfVar32[1];
          fVar83 = pfVar32[6];
          if (pfVar32[6] <= paVar2->m128[0xd4]) {
            fVar83 = paVar2->m128[0xd4];
          }
          fVar92 = pfVar32[4];
          paVar2->m128[0xd4] = fVar83;
          bVar55 = (uint)pfVar32[(long)(int)fVar91 * 8] < (uint)fStack_21ffc;
          if (bVar55) {
            fStack_21ff4 = (float)uVar53;
          }
          fVar83 = (float)uVar39;
          if (bVar55) {
            fStack_21ff8 = fVar83;
          }
          pfVar40 = pfVar32 + (long)(int)fVar91 * 8;
          if (bVar55) {
            fStack_21ffc = pfVar32[(long)(int)fVar91 * 8];
          }
          fVar91 = 0.0;
          for (; fVar93 = (float)uVar53, pfVar40 != pfVar34;
              pfVar40 = pfVar40 + (long)(int)pfVar40[1] * 8) {
            auVar94 = *(undefined1 (*) [16])(pcVar8 + (uint)*pfVar40 * uVar28);
            pfVar32 = *(float **)(paVar2->m128 + 0x90);
            if ((0x20 < (int)fVar93 + 1U) && (pfVar32 == pfVar48)) {
              pvVar30 = Vec3fa::operator_new__(0x800);
              *(void **)(paVar2->m128 + 0x90) = pvVar30;
              for (lVar31 = 0; lVar31 != 0x200; lVar31 = lVar31 + 0x10) {
                lVar9 = *(long *)(paVar2->m128 + 0x90);
                puVar4 = (undefined8 *)((long)paVar25 + lVar31 + lVar44);
                uVar23 = puVar4[1];
                *(undefined8 *)(lVar9 + lVar31) = *puVar4;
                ((undefined8 *)(lVar9 + lVar31))[1] = uVar23;
              }
              pfVar32 = *(float **)(paVar2->m128 + 0x90);
            }
            auStack_21fa0._0_8_ = auVar94._0_8_;
            auStack_21fa0._8_8_ = auVar94._8_8_;
            *(undefined8 *)(pfVar32 + uVar53 * 4) = auStack_21fa0._0_8_;
            *(undefined8 *)(pfVar32 + uVar53 * 4 + 2) = auStack_21fa0._8_8_;
            fVar91 = (float)((int)fVar91 + 1);
            uVar53 = (ulong)((int)fVar93 + 1U);
          }
          fVar38 = (float)((int)fVar83 + 1);
          pfVar32 = *(float **)(paVar2->m128 + 0xc0);
          if ((0x10 < (uint)fVar38) && (pfVar32 == pfVar29)) {
            pvVar30 = operator_new__(0x200);
            *(void **)(paVar2->m128 + 0xc0) = pvVar30;
            for (lVar31 = 0; lVar31 != 0x10; lVar31 = lVar31 + 1) {
              *(undefined8 *)(*(long *)(paVar2->m128 + 0xc0) + lVar31 * 8) =
                   *(undefined8 *)((long)paVar25 + lVar31 * 8 + lVar36);
            }
            pfVar32 = *(float **)(paVar2->m128 + 0xc0);
          }
          pfVar32[uVar39 * 2] = fVar91;
          pfVar32[uVar39 * 2 + 1] = fVar92;
          *(byte *)(paVar2->m128 + 0xd6) = *(byte *)(paVar2->m128 + 0xd6) & fVar91 == 2.8026e-45;
          if ((long)(int)pfVar34[3] == 0) {
            if ((uint)*pfVar34 < (uint)fStack_21ffc) {
              fStack_21ffc = *pfVar34;
              fStack_21ff4 = fVar93;
              fStack_21ff8 = fVar38;
            }
            paVar2->m128[0xd2] = fVar38;
            uVar39 = (ulong)((int)fVar83 + 2U);
            pfVar32 = *(float **)(paVar2->m128 + 0xc0);
            if ((0x10 < (int)fVar83 + 2U) && (pfVar32 == pfVar29)) {
              pvVar30 = operator_new__(0x200);
              *(void **)(paVar2->m128 + 0xc0) = pvVar30;
              for (lVar31 = 0; lVar31 != 0x10; lVar31 = lVar31 + 1) {
                *(undefined8 *)(*(long *)(paVar2->m128 + 0xc0) + lVar31 * 8) =
                     *(undefined8 *)((long)paVar25 + lVar31 * 8 + lVar36);
              }
              pfVar32 = *(float **)(paVar2->m128 + 0xc0);
            }
            (pfVar32 + (ulong)(uint)fVar38 * 2)[0] = 2.8026e-45;
            (pfVar32 + (ulong)(uint)fVar38 * 2)[1] = INFINITY;
            auVar94 = *(undefined1 (*) [16])(pcVar8 + (uint)*pfVar34 * uVar28);
            pfVar32 = *(float **)(paVar2->m128 + 0x90);
            if ((0x20 < (int)fVar93 + 1U) && (pfVar32 == pfVar48)) {
              pvVar30 = Vec3fa::operator_new__(0x800);
              *(void **)(paVar2->m128 + 0x90) = pvVar30;
              for (lVar31 = 0; lVar31 != 0x200; lVar31 = lVar31 + 0x10) {
                lVar9 = *(long *)(paVar2->m128 + 0x90);
                puVar4 = (undefined8 *)((long)paVar25 + lVar31 + lVar44);
                uVar23 = puVar4[1];
                *(undefined8 *)(lVar9 + lVar31) = *puVar4;
                ((undefined8 *)(lVar9 + lVar31))[1] = uVar23;
              }
              pfVar32 = *(float **)(paVar2->m128 + 0x90);
            }
            auStack_21fa0._0_8_ = auVar94._0_8_;
            auStack_21fa0._8_8_ = auVar94._8_8_;
            *(undefined8 *)(pfVar32 + uVar53 * 4) = auStack_21fa0._0_8_;
            *(undefined8 *)(pfVar32 + uVar53 * 4 + 2) = auStack_21fa0._8_8_;
            uVar53 = (ulong)((int)fVar93 + 2U);
            pfVar32 = *(float **)(paVar2->m128 + 0x90);
            if ((0x20 < (int)fVar93 + 2U) && (pfVar32 == pfVar48)) {
              pvVar30 = Vec3fa::operator_new__(0x800);
              *(void **)(paVar2->m128 + 0x90) = pvVar30;
              for (lVar31 = 0; lVar31 != 0x200; lVar31 = lVar31 + 0x10) {
                lVar9 = *(long *)(paVar2->m128 + 0x90);
                puVar4 = (undefined8 *)((long)paVar25 + lVar31 + lVar44);
                uVar23 = puVar4[1];
                *(undefined8 *)(lVar9 + lVar31) = *puVar4;
                ((undefined8 *)(lVar9 + lVar31))[1] = uVar23;
              }
              pfVar32 = *(float **)(paVar2->m128 + 0x90);
            }
            fVar83 = *(float *)((long)paVar2 + 4);
            uVar23 = *(undefined8 *)&(paVar2->field_1).z;
            pfVar32 = pfVar32 + (ulong)((int)fVar93 + 1U) * 4;
            pfVar32[0] = *(float *)paVar2;
            pfVar32[1] = fVar83;
            *(undefined8 *)(pfVar32 + 2) = uVar23;
            for (pfVar32 = pfStack_21f88; lVar31 = (long)(int)pfVar32[3], lVar31 != 0;
                pfVar32 = pfVar32 + lVar31 * 8 + (long)(int)pfVar32[lVar31 * 8 + 1] * 8) {
            }
          }
          else {
            pfVar32 = pfVar34 + (long)(int)pfVar34[3] * 8;
            uVar39 = (ulong)(uint)fVar38;
          }
        } while (pfVar32 != pfStack_21f88);
        paVar2->m128[0xd1] = (float)uVar53;
        paVar2->m128[0xd0] = (float)uVar39;
        paVar2->m128[0xd9] = fStack_21ffc;
        paVar2->m128[0xd7] = fStack_21ff8;
        paVar2->m128[0xd8] = fStack_21ff4;
        if (0xe < uVar47) break;
        pfStack_21f88 = pfStack_21f88 + (long)(int)pfStack_21f88[1] * 8;
        lVar44 = lVar44 + 0x380;
        lVar36 = lVar36 + 0x380;
        uVar47 = uVar1;
      } while (pfStack_21f88 != pfVar37);
      uStack_202c0 = (undefined4)uVar1;
      pfVar37 = (float *)0x0;
      if ((patch->flags & 0x10) != 0) {
        pfVar37 = patch->level;
      }
      paVar50 = Nx;
      paVar52 = Nx;
      if (Nx != (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)0x0) {
        Nx = local_4100;
        paVar50 = local_c0;
        paVar52 = local_8140;
      }
      feature_adaptive_eval_grid<embree::sse2::FeatureAdaptiveEvalGrid,embree::GeneralCatmullClarkPatchT<embree::Vec3fa,embree::Vec3fa>>
                ((GeneralCatmullClarkPatchT<embree::Vec3fa,_embree::Vec3fa> *)&aStack_21f00.field_1,
                 (uint)patch->patch_v[0][0].field_0.m128[2],pfVar37,x0,x1,y0,y1,swidth,sheight,
                 pfStack_1c280,pfStack_18240,local_c180,pfStack_101c0,pfStack_14200,Nx->v,paVar52->v
                 ,paVar50->v,uVar27,uVar41);
      GeneralCatmullClarkPatchT<embree::Vec3fa,_embree::Vec3fa>::~GeneralCatmullClarkPatchT
                ((GeneralCatmullClarkPatchT<embree::Vec3fa,_embree::Vec3fa> *)&aStack_21f00.field_1)
      ;
    }
    else {
      pfVar37 = (float *)0x0;
      if ((patch->flags & 0x10) != 0) {
        pfVar37 = patch->level;
      }
      paVar50 = Nx;
      paVar52 = Nx;
      if (Nx != (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)0x0) {
        Nx = local_c0;
        paVar50 = local_4100;
        paVar52 = local_8140;
      }
      feature_adaptive_eval_grid<embree::sse2::PatchEvalGrid,embree::PatchT<embree::Vec3fa,embree::Vec3fa>::Ref>
                (pRVar6 + (ulong)(patch->prim * (geom->super_Geometry).numTimeSteps + patch->time_)
                          * 8,(uint)patch->patch_v[0][0].field_0.m128[2],pfVar37,x0,x1,y0,y1,swidth,
                 sheight,pfStack_1c280,pfStack_18240,local_c180,pfStack_101c0,pfStack_14200,
                 paVar50->v,paVar52->v,Nx->v,uVar27,uVar41);
    }
    pcVar10 = *(code **)&(geom->super_Geometry).field_0x58;
    if (pcVar10 != (code *)0x0) {
      aStack_21f00._0_8_ = (geom->super_Geometry).userPtr;
      aStack_21f00._8_8_ = geom;
      uStack_21ef0 = patch->prim;
      uStack_21eec = patch->time_;
      pfStack_21ee8 = pfStack_101c0;
      pfStack_21ee0 = pfStack_14200;
      paStack_21ed8 = local_4100;
      paStack_21ed0 = local_8140;
      paStack_21ec8 = local_c0;
      pfStack_21ec0 = pfStack_1c280;
      pfStack_21eb8 = pfStack_18240;
      pfStack_21eb0 = local_c180;
      uStack_21ea8 = uVar42;
      (*pcVar10)();
    }
    uVar42 = uVar42 - 1;
    fVar83 = pfStack_101c0[uVar42];
    fVar91 = pfStack_14200[uVar42];
    fVar92 = pfStack_1c280[uVar42];
    fVar93 = pfStack_18240[uVar42];
    fVar38 = local_c180[uVar42];
    for (; uVar51 < (uVar33 & 0xfffffffc); uVar51 = uVar51 + 1) {
      pfStack_101c0[uVar51] = fVar83;
      pfStack_14200[uVar51] = fVar91;
      pfStack_1c280[uVar51] = fVar92;
      pfStack_18240[uVar51] = fVar93;
      local_c180[uVar51] = fVar38;
    }
    auVar94 = _DAT_01f45a40;
    auVar86 = _DAT_01f45a40;
    auVar77 = _DAT_01f45a40;
    auVar80 = _DAT_01f45a30;
    auVar88 = _DAT_01f45a30;
    auVar98 = _DAT_01f45a30;
    for (lVar44 = 0; (ulong)(uVar33 >> 2) << 4 != lVar44; lVar44 = lVar44 + 0x10) {
      auVar98 = minps(auVar98,*(undefined1 (*) [16])((long)pfStack_1c280 + lVar44));
      auVar88 = minps(auVar88,*(undefined1 (*) [16])((long)pfStack_18240 + lVar44));
      auVar80 = minps(auVar80,*(undefined1 (*) [16])((long)local_c180 + lVar44));
      auVar77 = maxps(auVar77,*(undefined1 (*) [16])((long)pfStack_1c280 + lVar44));
      auVar86 = maxps(auVar86,*(undefined1 (*) [16])((long)pfStack_18240 + lVar44));
      auVar94 = maxps(auVar94,*(undefined1 (*) [16])((long)local_c180 + lVar44));
    }
    auVar102._4_4_ = auVar98._0_4_;
    auVar102._0_4_ = auVar98._4_4_;
    auVar102._8_4_ = auVar98._12_4_;
    auVar102._12_4_ = auVar98._8_4_;
    auVar102 = minps(auVar102,auVar98);
    auVar17._4_8_ = auVar98._8_8_;
    auVar17._0_4_ = auVar102._4_4_;
    auVar98._0_8_ = auVar17._0_8_ << 0x20;
    auVar98._8_4_ = auVar102._8_4_;
    auVar98._12_4_ = auVar102._12_4_;
    auVar99._8_8_ = auVar102._8_8_;
    auVar99._0_8_ = auVar98._8_8_;
    if (auVar102._0_4_ <= auVar102._8_4_) {
      auVar99._0_4_ = auVar102._0_4_;
    }
    (__return_storage_ptr__->lower).field_0.m128[0] = auVar99._0_4_;
    auVar100._4_4_ = auVar88._0_4_;
    auVar100._0_4_ = auVar88._4_4_;
    auVar100._8_4_ = auVar88._12_4_;
    auVar100._12_4_ = auVar88._8_4_;
    auVar98 = minps(auVar100,auVar88);
    auVar18._4_8_ = auVar88._8_8_;
    auVar18._0_4_ = auVar98._4_4_;
    auVar88._0_8_ = auVar18._0_8_ << 0x20;
    auVar88._8_4_ = auVar98._8_4_;
    auVar88._12_4_ = auVar98._12_4_;
    auVar89._8_8_ = auVar98._8_8_;
    auVar89._0_8_ = auVar88._8_8_;
    if (auVar98._0_4_ <= auVar98._8_4_) {
      auVar89._0_4_ = auVar98._0_4_;
    }
    (__return_storage_ptr__->lower).field_0.m128[1] = auVar89._0_4_;
    auVar90._4_4_ = auVar80._0_4_;
    auVar90._0_4_ = auVar80._4_4_;
    auVar90._8_4_ = auVar80._12_4_;
    auVar90._12_4_ = auVar80._8_4_;
    auVar88 = minps(auVar90,auVar80);
    auVar19._4_8_ = auVar80._8_8_;
    auVar19._0_4_ = auVar88._4_4_;
    auVar80._0_8_ = auVar19._0_8_ << 0x20;
    auVar80._8_4_ = auVar88._8_4_;
    auVar80._12_4_ = auVar88._12_4_;
    auVar81._8_8_ = auVar88._8_8_;
    auVar81._0_8_ = auVar80._8_8_;
    if (auVar88._0_4_ <= auVar88._8_4_) {
      auVar81._0_4_ = auVar88._0_4_;
    }
    (__return_storage_ptr__->lower).field_0.m128[2] = auVar81._0_4_;
    auVar82._4_4_ = auVar77._0_4_;
    auVar82._0_4_ = auVar77._4_4_;
    auVar82._8_4_ = auVar77._12_4_;
    auVar82._12_4_ = auVar77._8_4_;
    auVar80 = maxps(auVar82,auVar77);
    auVar20._4_8_ = auVar77._8_8_;
    auVar20._0_4_ = auVar80._4_4_;
    auVar77._0_8_ = auVar20._0_8_ << 0x20;
    auVar77._8_4_ = auVar80._8_4_;
    auVar77._12_4_ = auVar80._12_4_;
    auVar78._8_8_ = auVar80._8_8_;
    auVar78._0_8_ = auVar77._8_8_;
    if (auVar80._8_4_ <= auVar80._0_4_) {
      auVar78._0_4_ = auVar80._0_4_;
    }
    (__return_storage_ptr__->upper).field_0.m128[0] = auVar78._0_4_;
    auVar79._4_4_ = auVar86._0_4_;
    auVar79._0_4_ = auVar86._4_4_;
    auVar79._8_4_ = auVar86._12_4_;
    auVar79._12_4_ = auVar86._8_4_;
    auVar77 = maxps(auVar79,auVar86);
    auVar21._4_8_ = auVar86._8_8_;
    auVar21._0_4_ = auVar77._4_4_;
    auVar86._0_8_ = auVar21._0_8_ << 0x20;
    auVar86._8_4_ = auVar77._8_4_;
    auVar86._12_4_ = auVar77._12_4_;
    auVar75._8_8_ = auVar77._8_8_;
    auVar75._0_8_ = auVar86._8_8_;
    if (auVar77._8_4_ <= auVar77._0_4_) {
      auVar75._0_4_ = auVar77._0_4_;
    }
    (__return_storage_ptr__->upper).field_0.m128[1] = auVar75._0_4_;
    auVar76._4_4_ = auVar94._0_4_;
    auVar76._0_4_ = auVar94._4_4_;
    auVar76._8_4_ = auVar94._12_4_;
    auVar76._12_4_ = auVar94._8_4_;
    auVar86 = maxps(auVar76,auVar94);
    auVar22._4_8_ = auVar94._8_8_;
    auVar22._0_4_ = auVar86._4_4_;
    auVar94._0_8_ = auVar22._0_8_ << 0x20;
    auVar94._8_4_ = auVar86._8_4_;
    auVar94._12_4_ = auVar86._12_4_;
    auVar62._8_8_ = auVar86._8_8_;
    auVar62._0_8_ = auVar94._8_8_;
    if (auVar86._8_4_ <= auVar86._0_4_) {
      auVar62._0_4_ = auVar86._0_4_;
    }
    (__return_storage_ptr__->upper).field_0.m128[2] = auVar62._0_4_;
    if (local_c0 != local_40c0) {
      alignedFree(local_c0);
    }
    if (local_8140 != local_c140) {
      alignedFree(local_8140);
    }
    if (local_4100 != local_8100) {
      alignedFree(local_4100);
    }
    if (local_c180 != (float *)auStack_10180) {
      alignedFree(local_c180);
    }
    if (pfStack_18240 != (float *)auStack_1c240) {
      alignedFree(pfStack_18240);
    }
    if (pfStack_1c280 != (float *)&uStack_20280) {
      alignedFree(pfStack_1c280);
    }
  }
  else {
    uVar45 = swidth - 1;
    uVar54 = sheight - 1;
    auVar84._0_4_ = (float)(int)uVar45;
    auVar84._4_4_ = (float)(int)uVar45;
    auVar84._8_4_ = (float)(int)uVar45;
    auVar84._12_4_ = (float)(int)uVar45;
    auVar94 = rcpps(in_XMM5,auVar84);
    fVar83 = auVar94._0_4_;
    fVar91 = auVar94._4_4_;
    fVar92 = auVar94._8_4_;
    fVar93 = auVar94._12_4_;
    auVar95._0_4_ = (float)(int)uVar54;
    auVar95._4_4_ = (float)(int)uVar54;
    auVar95._8_4_ = (float)(int)uVar54;
    auVar95._12_4_ = (float)(int)uVar54;
    auVar94 = rcpps(in_XMM6,auVar95);
    fVar38 = auVar94._0_4_;
    fVar103 = auVar94._4_4_;
    fVar104 = auVar94._8_4_;
    fVar105 = auVar94._12_4_;
    lVar44 = 0;
    iVar106 = 0;
    iVar107 = 0;
    iVar108 = 0;
    iVar109 = 0;
    for (uVar46 = 0; uVar46 != uVar41; uVar46 = uVar46 + 1) {
      iVar110 = 0;
      iVar111 = 1;
      iVar112 = 2;
      iVar113 = 3;
      for (uVar47 = 0; uVar47 < uVar27; uVar47 = uVar47 + 4) {
        uVar49 = (int)lVar44 + (int)uVar47;
        pfVar37 = pfStack_101c0 + uVar49;
        *pfVar37 = (float)(~-(uint)(iVar110 < (int)uVar45) & 0x3f800000 |
                          (uint)((float)(int)(iVar110 + x0) *
                                ((1.0 - auVar84._0_4_ * fVar83) * fVar83 + fVar83)) &
                          -(uint)(iVar110 < (int)uVar45));
        pfVar37[1] = (float)(~-(uint)(iVar111 < (int)uVar45) & 0x3f800000 |
                            (uint)((float)(int)(iVar111 + x0) *
                                  ((1.0 - auVar84._4_4_ * fVar91) * fVar91 + fVar91)) &
                            -(uint)(iVar111 < (int)uVar45));
        pfVar37[2] = (float)(~-(uint)(iVar112 < (int)uVar45) & 0x3f800000 |
                            (uint)((float)(int)(iVar112 + x0) *
                                  ((1.0 - auVar84._8_4_ * fVar92) * fVar92 + fVar92)) &
                            -(uint)(iVar112 < (int)uVar45));
        pfVar37[3] = (float)(~-(uint)(iVar113 < (int)uVar45) & 0x3f800000 |
                            (uint)((float)(int)(iVar113 + x0) *
                                  ((1.0 - auVar84._12_4_ * fVar93) * fVar93 + fVar93)) &
                            -(uint)(iVar113 < (int)uVar45));
        pfVar37 = pfStack_14200 + uVar49;
        *pfVar37 = (float)(~-(uint)(iVar106 < (int)uVar54) & 0x3f800000 |
                          (uint)((float)(int)(iVar106 + y0) *
                                ((1.0 - auVar95._0_4_ * fVar38) * fVar38 + fVar38)) &
                          -(uint)(iVar106 < (int)uVar54));
        pfVar37[1] = (float)(~-(uint)(iVar107 < (int)uVar54) & 0x3f800000 |
                            (uint)((float)(int)(iVar107 + y0) *
                                  ((1.0 - auVar95._4_4_ * fVar103) * fVar103 + fVar103)) &
                            -(uint)(iVar107 < (int)uVar54));
        pfVar37[2] = (float)(~-(uint)(iVar108 < (int)uVar54) & 0x3f800000 |
                            (uint)((float)(int)(iVar108 + y0) *
                                  ((1.0 - auVar95._8_4_ * fVar104) * fVar104 + fVar104)) &
                            -(uint)(iVar108 < (int)uVar54));
        pfVar37[3] = (float)(~-(uint)(iVar109 < (int)uVar54) & 0x3f800000 |
                            (uint)((float)(int)(iVar109 + y0) *
                                  ((1.0 - auVar95._12_4_ * fVar105) * fVar105 + fVar105)) &
                            -(uint)(iVar109 < (int)uVar54));
        iVar110 = iVar110 + 4;
        iVar111 = iVar111 + 4;
        iVar112 = iVar112 + 4;
        iVar113 = iVar113 + 4;
      }
      iVar106 = iVar106 + 1;
      iVar107 = iVar107 + 1;
      iVar108 = iVar108 + 1;
      iVar109 = iVar109 + 1;
      lVar44 = lVar44 + (ulong)uVar27;
    }
    fVar83 = pfStack_101c0[uVar42 - 1];
    fVar91 = pfStack_14200[uVar42 - 1];
    for (; uVar51 < (uVar33 & 0xfffffffc); uVar51 = uVar51 + 1) {
      pfStack_101c0[uVar51] = fVar83;
      pfStack_14200[uVar51] = fVar91;
    }
    if ((patch->flags & 0x10) != 0) {
      fVar83 = patch->level[1];
      fVar91 = patch->level[2];
      iVar106 = (int)(long)patch->level[0];
      fVar92 = patch->level[3];
      iVar107 = (int)(long)fVar91;
      if (iVar106 + 1U < swidth && y0 == 0) {
        fVar93 = (float)((long)patch->level[0] & 0xffffffff);
        auVar94 = rcpss(ZEXT416((uint)fVar93),ZEXT416((uint)fVar93));
        iVar108 = (x0 * 2 + 1) * iVar106;
        auStack_21ff0._0_8_ = pfStack_101c0;
        for (uVar42 = x0; uVar42 <= x1; uVar42 = uVar42 + 1) {
          *(float *)auStack_21ff0._0_8_ =
               (float)(iVar108 / (int)(swidth * 2 + -2)) *
               (2.0 - fVar93 * auVar94._0_4_) * auVar94._0_4_;
          iVar108 = iVar108 + iVar106 * 2;
          auStack_21ff0._0_8_ = auStack_21ff0._0_8_ + 4;
        }
        if (uVar45 == x1) {
          pfStack_101c0[uVar26] = 1.0;
        }
      }
      iVar106 = (int)(long)fVar83;
      if (iVar107 + 1U < swidth && y1 + 1 == sheight) {
        fVar91 = (float)((long)fVar91 & 0xffffffff);
        auVar94 = rcpss(ZEXT416((uint)fVar91),ZEXT416((uint)fVar91));
        iVar108 = (x0 * 2 + 1) * iVar107;
        pfVar37 = pfStack_101c0 + iVar35 * uVar27;
        for (uVar42 = x0; uVar42 <= x1; uVar42 = uVar42 + 1) {
          *pfVar37 = (float)(iVar108 / (int)(swidth * 2 + -2)) *
                     (2.0 - fVar91 * auVar94._0_4_) * auVar94._0_4_;
          iVar108 = iVar108 + iVar107 * 2;
          pfVar37 = pfVar37 + 1;
        }
        if (uVar45 == x1) {
          (pfStack_101c0 + iVar35 * uVar27)[uVar26] = 1.0;
        }
      }
      iVar107 = (int)(long)fVar92;
      if (iVar106 + 1U < sheight && x0 == 0) {
        fVar83 = (float)((long)fVar83 & 0xffffffff);
        auVar94 = rcpss(ZEXT416((uint)fVar83),ZEXT416((uint)fVar83));
        iVar108 = (y0 * 2 + 1) * iVar106;
        uVar47 = 0;
        for (uVar42 = y0; uVar42 <= y1; uVar42 = uVar42 + 1) {
          pfStack_14200[uVar26 + uVar47] =
               (float)(iVar108 / (int)(sheight * 2 + -2)) *
               (2.0 - fVar83 * auVar94._0_4_) * auVar94._0_4_;
          iVar108 = iVar108 + iVar106 * 2;
          uVar47 = (ulong)((int)uVar47 + uVar27);
        }
        if (uVar54 == y1) {
          pfStack_14200[(ulong)uVar26 + (ulong)(iVar35 * uVar27)] = 1.0;
        }
      }
      if (iVar107 + 1U < sheight && x1 + 1 == swidth) {
        fVar83 = (float)((long)fVar92 & 0xffffffff);
        auVar94 = rcpss(ZEXT416((uint)fVar83),ZEXT416((uint)fVar83));
        iVar106 = (y0 * 2 + 1) * iVar107;
        uVar47 = 0;
        while (auVar86 = _uStack_21fd0, (uint)uStack_21fd0 <= y1) {
          pfStack_14200[uVar47] =
               (float)(iVar106 / (int)(sheight * 2 + -2)) *
               (2.0 - fVar83 * auVar94._0_4_) * auVar94._0_4_;
          uStack_21fd0._4_4_ = 0;
          uStack_21fd0._0_4_ = (uint)uStack_21fd0 + 1;
          uStack_21fc8 = auVar86._8_8_;
          iVar106 = iVar106 + iVar107 * 2;
          uVar47 = (ulong)((int)uVar47 + uVar27);
        }
        if (uVar54 == y1) {
          pfStack_14200[iVar35 * uVar27] = 1.0;
        }
      }
    }
    auStack_21fc0._8_8_ = 0x7f8000007f800000;
    auStack_21fc0._0_8_ = 0x7f8000007f800000;
    auStack_21fb0._8_8_ = 0x7f8000007f800000;
    auStack_21fb0._0_8_ = 0x7f8000007f800000;
    auStack_21ff0 = _DAT_01f45a40;
    auVar94 = _DAT_01f45a40;
    for (lVar44 = 0; (ulong)(uVar33 >> 2) << 4 != lVar44; lVar44 = lVar44 + 0x10) {
      local_8100[0]._0_8_ = *(undefined8 *)((long)pfStack_101c0 + lVar44);
      local_8100[0]._8_8_ = ((undefined8 *)((long)pfStack_101c0 + lVar44))[1];
      local_c140[0]._0_8_ = *(undefined8 *)((long)pfStack_14200 + lVar44);
      local_c140[0]._8_8_ = ((undefined8 *)((long)pfStack_14200 + lVar44))[1];
      patchEval<embree::vfloat_impl<4>>
                (patch,(vfloat_impl<4> *)local_8100,(vfloat_impl<4> *)local_c140);
      if (*(long *)&(geom->super_Geometry).field_0x58 != 0) {
        patchNormal<embree::vfloat_impl<4>>
                  (patch,(vfloat_impl<4> *)local_8100,(vfloat_impl<4> *)local_c140);
        auVar85._0_4_ = fStack_20270 * fStack_20270 + (float)uStack_20260 * (float)uStack_20260;
        auVar85._4_4_ = fStack_2026c * fStack_2026c + uStack_20260._4_4_ * uStack_20260._4_4_;
        auVar85._8_4_ =
             (float)uStack_20268 * (float)uStack_20268 + (float)uStack_20258 * (float)uStack_20258;
        auVar85._12_4_ =
             uStack_20268._4_4_ * uStack_20268._4_4_ + uStack_20258._4_4_ * uStack_20258._4_4_;
        auVar96._0_4_ = (float)uStack_20280 * (float)uStack_20280 + auVar85._0_4_;
        auVar96._4_4_ = uStack_20280._4_4_ * uStack_20280._4_4_ + auVar85._4_4_;
        auVar96._8_4_ = (float)uStack_20278 * (float)uStack_20278 + auVar85._8_4_;
        auVar96._12_4_ = uStack_20278._4_4_ * uStack_20278._4_4_ + auVar85._12_4_;
        uVar26 = -(uint)(auVar96._0_4_ != 0.0);
        uVar27 = -(uint)(auVar96._4_4_ != 0.0);
        uVar42 = -(uint)(auVar96._8_4_ != 0.0);
        uVar41 = -(uint)(auVar96._12_4_ != 0.0);
        auVar86 = rsqrtps(auVar85,auVar96);
        fVar83 = auVar86._0_4_;
        fVar91 = auVar86._4_4_;
        fVar92 = auVar86._8_4_;
        fVar93 = auVar86._12_4_;
        fVar83 = fVar83 * fVar83 * auVar96._0_4_ * -0.5 * fVar83 + fVar83 * 1.5;
        fVar91 = fVar91 * fVar91 * auVar96._4_4_ * -0.5 * fVar91 + fVar91 * 1.5;
        fVar92 = fVar92 * fVar92 * auVar96._8_4_ * -0.5 * fVar92 + fVar92 * 1.5;
        fVar93 = fVar93 * fVar93 * auVar96._12_4_ * -0.5 * fVar93 + fVar93 * 1.5;
        auVar97._0_4_ = ~uVar26 & (uint)(float)uStack_20280;
        auVar97._4_4_ = ~uVar27 & (uint)uStack_20280._4_4_;
        auVar97._8_4_ = ~uVar42 & (uint)(float)uStack_20278;
        auVar97._12_4_ = ~uVar41 & (uint)uStack_20278._4_4_;
        auVar101._0_4_ = ~uVar26 & (uint)fStack_20270;
        auVar101._4_4_ = ~uVar27 & (uint)fStack_2026c;
        auVar101._8_4_ = ~uVar42 & (uint)(float)uStack_20268;
        auVar101._12_4_ = ~uVar41 & (uint)uStack_20268._4_4_;
        auStack_10180._0_4_ = (uint)((float)uStack_20280 * fVar83) & uVar26;
        auStack_10180._4_4_ = (uint)(uStack_20280._4_4_ * fVar91) & uVar27;
        auStack_10180._8_4_ = (uint)((float)uStack_20278 * fVar92) & uVar42;
        auStack_10180._12_4_ = (uint)(uStack_20278._4_4_ * fVar93) & uVar41;
        auStack_10180 = auStack_10180 | auVar97;
        auStack_10170._0_4_ = (uint)(fStack_20270 * fVar83) & uVar26;
        auStack_10170._4_4_ = (uint)(fStack_2026c * fVar91) & uVar27;
        auStack_10170._8_4_ = (uint)((float)uStack_20268 * fVar92) & uVar42;
        auStack_10170._12_4_ = (uint)(uStack_20268._4_4_ * fVar93) & uVar41;
        auStack_10170 = auStack_10170 | auVar101;
        auVar87._0_4_ = (uint)(fVar83 * (float)uStack_20260) & uVar26;
        auVar87._4_4_ = (uint)(fVar91 * uStack_20260._4_4_) & uVar27;
        auVar87._8_4_ = (uint)(fVar92 * (float)uStack_20258) & uVar42;
        auVar87._12_4_ = (uint)(fVar93 * uStack_20258._4_4_) & uVar41;
        aauStack_10160[0]._0_4_ = ~uVar26 & (uint)(float)uStack_20260;
        aauStack_10160[0]._4_4_ = ~uVar27 & (uint)uStack_20260._4_4_;
        aauStack_10160[0]._8_4_ = ~uVar42 & (uint)(float)uStack_20258;
        aauStack_10160[0]._12_4_ = ~uVar41 & (uint)uStack_20258._4_4_;
        aauStack_10160[0] = aauStack_10160[0] | auVar87;
        uStack_20280 = (geom->super_Geometry).userPtr;
        uStack_20278 = geom;
        fStack_20270 = (float)patch->prim;
        fStack_2026c = (float)patch->time_;
        uStack_20258 = auStack_10180;
        puStack_20250 = auStack_10170;
        pauStack_20248 = aauStack_10160;
        puStack_20240 = auStack_1c240;
        puStack_20238 = auStack_1c230;
        pauStack_20230 = aauStack_1c220;
        uStack_20228 = 4;
        uStack_20268 = local_8100;
        uStack_20260 = local_c140;
        (**(code **)&(geom->super_Geometry).field_0x58)(&uStack_20280);
      }
      auStack_22030 = minps(auStack_22030,auStack_1c240);
      auStack_21ff0 = maxps(auStack_21ff0,auStack_1c240);
      auStack_21fc0 = minps(auStack_21fc0,auStack_1c230);
      auVar94 = maxps(auVar94,auStack_1c230);
      auStack_21fb0 = minps(auStack_21fb0,aauStack_1c220[0]);
      auStack_21fa0 = maxps(auStack_21fa0,aauStack_1c220[0]);
    }
    auVar56._4_4_ = auStack_22030._0_4_;
    auVar56._0_4_ = auStack_22030._4_4_;
    auVar56._8_4_ = auStack_22030._12_4_;
    auVar56._12_4_ = auStack_22030._8_4_;
    auVar86 = minps(auVar56,auStack_22030);
    auVar11._4_8_ = auStack_22030._8_8_;
    auVar11._0_4_ = auVar86._4_4_;
    auVar63._0_8_ = auVar11._0_8_ << 0x20;
    auVar63._8_4_ = auVar86._8_4_;
    auVar63._12_4_ = auVar86._12_4_;
    auVar64._8_8_ = auVar86._8_8_;
    auVar64._0_8_ = auVar63._8_8_;
    if (auVar86._0_4_ <= auVar86._8_4_) {
      auVar64._0_4_ = auVar86._0_4_;
    }
    (__return_storage_ptr__->lower).field_0.m128[0] = auVar64._0_4_;
    auVar57._4_4_ = auStack_21fc0._0_4_;
    auVar57._0_4_ = auStack_21fc0._4_4_;
    auVar57._8_4_ = auStack_21fc0._12_4_;
    auVar57._12_4_ = auStack_21fc0._8_4_;
    auVar86 = minps(auVar57,auStack_21fc0);
    auVar12._4_8_ = auStack_21fc0._8_8_;
    auVar12._0_4_ = auVar86._4_4_;
    auVar65._0_8_ = auVar12._0_8_ << 0x20;
    auVar65._8_4_ = auVar86._8_4_;
    auVar65._12_4_ = auVar86._12_4_;
    auVar66._8_8_ = auVar86._8_8_;
    auVar66._0_8_ = auVar65._8_8_;
    if (auVar86._0_4_ <= auVar86._8_4_) {
      auVar66._0_4_ = auVar86._0_4_;
    }
    (__return_storage_ptr__->lower).field_0.m128[1] = auVar66._0_4_;
    auVar58._4_4_ = auStack_21fb0._0_4_;
    auVar58._0_4_ = auStack_21fb0._4_4_;
    auVar58._8_4_ = auStack_21fb0._12_4_;
    auVar58._12_4_ = auStack_21fb0._8_4_;
    auVar86 = minps(auVar58,auStack_21fb0);
    auVar13._4_8_ = auStack_21fb0._8_8_;
    auVar13._0_4_ = auVar86._4_4_;
    auVar67._0_8_ = auVar13._0_8_ << 0x20;
    auVar67._8_4_ = auVar86._8_4_;
    auVar67._12_4_ = auVar86._12_4_;
    auVar68._8_8_ = auVar86._8_8_;
    auVar68._0_8_ = auVar67._8_8_;
    if (auVar86._0_4_ <= auVar86._8_4_) {
      auVar68._0_4_ = auVar86._0_4_;
    }
    (__return_storage_ptr__->lower).field_0.m128[2] = auVar68._0_4_;
    auVar59._4_4_ = auStack_21ff0._0_4_;
    auVar59._0_4_ = auStack_21ff0._4_4_;
    auVar59._8_4_ = auStack_21ff0._12_4_;
    auVar59._12_4_ = auStack_21ff0._8_4_;
    auVar86 = maxps(auVar59,auStack_21ff0);
    auVar14._4_8_ = auStack_21ff0._8_8_;
    auVar14._0_4_ = auVar86._4_4_;
    auVar69._0_8_ = auVar14._0_8_ << 0x20;
    auVar69._8_4_ = auVar86._8_4_;
    auVar69._12_4_ = auVar86._12_4_;
    auVar70._8_8_ = auVar86._8_8_;
    auVar70._0_8_ = auVar69._8_8_;
    if (auVar86._8_4_ <= auVar86._0_4_) {
      auVar70._0_4_ = auVar86._0_4_;
    }
    (__return_storage_ptr__->upper).field_0.m128[0] = auVar70._0_4_;
    auVar60._4_4_ = auVar94._0_4_;
    auVar60._0_4_ = auVar94._4_4_;
    auVar60._8_4_ = auVar94._12_4_;
    auVar60._12_4_ = auVar94._8_4_;
    auVar94 = maxps(auVar60,auVar94);
    auVar15._4_8_ = auVar70._8_8_;
    auVar15._0_4_ = auVar94._4_4_;
    auVar71._0_8_ = auVar15._0_8_ << 0x20;
    auVar71._8_4_ = auVar94._8_4_;
    auVar71._12_4_ = auVar94._12_4_;
    auVar72._8_8_ = auVar94._8_8_;
    auVar72._0_8_ = auVar71._8_8_;
    if (auVar94._8_4_ <= auVar94._0_4_) {
      auVar72._0_4_ = auVar94._0_4_;
    }
    (__return_storage_ptr__->upper).field_0.m128[1] = auVar72._0_4_;
    auVar61._4_4_ = auStack_21fa0._0_4_;
    auVar61._0_4_ = auStack_21fa0._4_4_;
    auVar61._8_4_ = auStack_21fa0._12_4_;
    auVar61._12_4_ = auStack_21fa0._8_4_;
    auVar94 = maxps(auVar61,auStack_21fa0);
    auVar16._4_8_ = auStack_21fa0._8_8_;
    auVar16._0_4_ = auVar94._4_4_;
    auVar73._0_8_ = auVar16._0_8_ << 0x20;
    auVar73._8_4_ = auVar94._8_4_;
    auVar73._12_4_ = auVar94._12_4_;
    auVar74._8_8_ = auVar94._8_8_;
    auVar74._0_8_ = auVar73._8_8_;
    if (auVar94._8_4_ <= auVar94._0_4_) {
      auVar74._0_4_ = auVar94._0_4_;
    }
    (__return_storage_ptr__->upper).field_0.m128[2] = auVar74._0_4_;
  }
  if (pfStack_14200 != afStack_18200) {
    alignedFree(pfStack_14200);
  }
  if (pfStack_101c0 != afStack_141c0) {
    alignedFree(pfStack_101c0);
  }
  return __return_storage_ptr__;
}

Assistant:

BBox3fa evalGridBounds(const SubdivPatch1Base& patch,
                           const unsigned x0, const unsigned x1,
                           const unsigned y0, const unsigned y1,
                           const unsigned swidth, const unsigned sheight,
                           const SubdivMesh* const geom)
    {
      BBox3fa b(empty);
      const unsigned dwidth  = x1-x0+1;
      const unsigned dheight = y1-y0+1;
      const unsigned M = dwidth*dheight+VSIZEX;
      const unsigned grid_size_simd_blocks = (M-1)/VSIZEX;
      dynamic_large_stack_array(float,grid_u,M,64*64*sizeof(float));
      dynamic_large_stack_array(float,grid_v,M,64*64*sizeof(float));

      if (unlikely(patch.type == SubdivPatch1Base::EVAL_PATCH))
      {
        const bool displ = geom->displFunc;
        dynamic_large_stack_array(float,grid_x,M,64*64*sizeof(float));
        dynamic_large_stack_array(float,grid_y,M,64*64*sizeof(float));
        dynamic_large_stack_array(float,grid_z,M,64*64*sizeof(float));
        dynamic_large_stack_array(float,grid_Ng_x,displ ? M : 0,64*64*sizeof(float));
        dynamic_large_stack_array(float,grid_Ng_y,displ ? M : 0,64*64*sizeof(float));
        dynamic_large_stack_array(float,grid_Ng_z,displ ? M : 0,64*64*sizeof(float));

        if (geom->patch_eval_trees.size())
        {
          feature_adaptive_eval_grid<PatchEvalGrid> 
            (geom->patch_eval_trees[geom->numTimeSteps*patch.primID()+patch.time()], patch.subPatch(), patch.needsStitching() ? patch.level : nullptr,
             x0,x1,y0,y1,swidth,sheight,
             grid_x,grid_y,grid_z,grid_u,grid_v,
             displ ? (float*)grid_Ng_x : nullptr, displ ? (float*)grid_Ng_y : nullptr, displ ? (float*)grid_Ng_z : nullptr,
             dwidth,dheight);
        } 
        else 
        {
          GeneralCatmullClarkPatch3fa ccpatch(patch.edge(),geom->getVertexBuffer(patch.time()));
          
          feature_adaptive_eval_grid <FeatureAdaptiveEvalGrid,GeneralCatmullClarkPatch3fa>
            (ccpatch, patch.subPatch(), patch.needsStitching() ? patch.level : nullptr,
            x0,x1,y0,y1,swidth,sheight,
            grid_x,grid_y,grid_z,grid_u,grid_v,
            displ ? (float*)grid_Ng_x : nullptr, displ ? (float*)grid_Ng_y : nullptr, displ ? (float*)grid_Ng_z : nullptr,
            dwidth,dheight);
        }

        /* call displacement shader */
        if (unlikely(geom->displFunc))
        {
          RTCDisplacementFunctionNArguments args;
          args.geometryUserPtr = geom->userPtr;
          args.geometry = (RTCGeometry)geom;
          //args.geomID = patch.geomID();
          args.primID = patch.primID();
          args.timeStep = patch.time();
          args.u = grid_u;
          args.v = grid_v;
          args.Ng_x = grid_Ng_x;
          args.Ng_y = grid_Ng_y;
          args.Ng_z = grid_Ng_z;
          args.P_x = grid_x;
          args.P_y = grid_y;
          args.P_z = grid_z;
          args.N = dwidth*dheight;
          geom->displFunc(&args);
        }

        /* set last elements in u,v array to 1.0f */
        const float last_u = grid_u[dwidth*dheight-1];
        const float last_v = grid_v[dwidth*dheight-1];
        const float last_x = grid_x[dwidth*dheight-1];
        const float last_y = grid_y[dwidth*dheight-1];
        const float last_z = grid_z[dwidth*dheight-1];
        for (unsigned i=dwidth*dheight;i<grid_size_simd_blocks*VSIZEX;i++)
        {
          grid_u[i] = last_u;
          grid_v[i] = last_v;
          grid_x[i] = last_x;
          grid_y[i] = last_y;
          grid_z[i] = last_z;
        }

        vfloatx bounds_min_x = pos_inf;
        vfloatx bounds_min_y = pos_inf;
        vfloatx bounds_min_z = pos_inf;
        vfloatx bounds_max_x = neg_inf;
        vfloatx bounds_max_y = neg_inf;
        vfloatx bounds_max_z = neg_inf;
        for (unsigned i = 0; i<grid_size_simd_blocks; i++)
        {
          vfloatx x = vfloatx::loadu(&grid_x[i * VSIZEX]);
          vfloatx y = vfloatx::loadu(&grid_y[i * VSIZEX]);
          vfloatx z = vfloatx::loadu(&grid_z[i * VSIZEX]);

	  bounds_min_x = min(bounds_min_x,x);
	  bounds_min_y = min(bounds_min_y,y);
	  bounds_min_z = min(bounds_min_z,z);

	  bounds_max_x = max(bounds_max_x,x);
	  bounds_max_y = max(bounds_max_y,y);
	  bounds_max_z = max(bounds_max_z,z);
        }

        b.lower.x = reduce_min(bounds_min_x);  
        b.lower.y = reduce_min(bounds_min_y);
        b.lower.z = reduce_min(bounds_min_z);
        b.upper.x = reduce_max(bounds_max_x);
        b.upper.y = reduce_max(bounds_max_y);
        b.upper.z = reduce_max(bounds_max_z);
        //b.lower.a = 0;
        //b.upper.a = 0;
      }
      else
      {
        /* grid_u, grid_v need to be padded as we write with SIMD granularity */
        gridUVTessellator(patch.level,swidth,sheight,x0,y0,dwidth,dheight,grid_u,grid_v);
      
        /* set last elements in u,v array to last valid point */
        const float last_u = grid_u[dwidth*dheight-1];
        const float last_v = grid_v[dwidth*dheight-1];
        for (unsigned i=dwidth*dheight;i<grid_size_simd_blocks*VSIZEX;i++) {
          grid_u[i] = last_u;
          grid_v[i] = last_v;
        }

        /* stitch edges if necessary */
        if (unlikely(patch.needsStitching()))
          stitchUVGrid(patch.level,swidth,sheight,x0,y0,dwidth,dheight,grid_u,grid_v);
      
        /* iterates over all grid points */
        Vec3vfx bounds_min;
        bounds_min[0] = pos_inf;
        bounds_min[1] = pos_inf;
        bounds_min[2] = pos_inf;

        Vec3vfx bounds_max;
        bounds_max[0] = neg_inf;
        bounds_max[1] = neg_inf;
        bounds_max[2] = neg_inf;

        for (unsigned i=0; i<grid_size_simd_blocks; i++)
        {
          const vfloatx u = vfloatx::load(&grid_u[i*VSIZEX]);
          const vfloatx v = vfloatx::load(&grid_v[i*VSIZEX]);
          Vec3vfx vtx = patchEval(patch,u,v);
        
          /* evaluate displacement function */
          if (unlikely(geom->displFunc != nullptr))
          {
            const Vec3vfx normal = normalize_safe(patchNormal(patch,u,v));
            RTCDisplacementFunctionNArguments args;
            args.geometryUserPtr = geom->userPtr;
            args.geometry = (RTCGeometry)geom;
            //args.geomID = patch.geomID();
            args.primID = patch.primID();
            args.timeStep = patch.time();
            args.u = &u[0];
            args.v = &v[0];
            args.Ng_x = &normal.x[0];
            args.Ng_y = &normal.y[0];
            args.Ng_z = &normal.z[0];
            args.P_x = &vtx.x[0];
            args.P_y = &vtx.y[0];
            args.P_z = &vtx.z[0];
            args.N = VSIZEX;
            geom->displFunc(&args);
          }

          bounds_min[0] = min(bounds_min[0],vtx.x);
          bounds_max[0] = max(bounds_max[0],vtx.x);
          bounds_min[1] = min(bounds_min[1],vtx.y);
          bounds_max[1] = max(bounds_max[1],vtx.y);
          bounds_min[2] = min(bounds_min[2],vtx.z);
          bounds_max[2] = max(bounds_max[2],vtx.z);      
        }

        b.lower.x = reduce_min(bounds_min[0]);
        b.lower.y = reduce_min(bounds_min[1]);
        b.lower.z = reduce_min(bounds_min[2]);
        b.upper.x = reduce_max(bounds_max[0]);
        b.upper.y = reduce_max(bounds_max[1]);
        b.upper.z = reduce_max(bounds_max[2]);
        //b.lower.a = 0;
        //b.upper.a = 0;
      }

      assert( std::isfinite(b.lower.x) );
      assert( std::isfinite(b.lower.y) );
      assert( std::isfinite(b.lower.z) );

      assert( std::isfinite(b.upper.x) );
      assert( std::isfinite(b.upper.y) );
      assert( std::isfinite(b.upper.z) );


      assert(b.lower.x <= b.upper.x);
      assert(b.lower.y <= b.upper.y);
      assert(b.lower.z <= b.upper.z);
      return b;
    }